

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::querySamplerState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint sampler,
               GLenum pname,QueriedState *state)

{
  bool bVar1;
  char *pcVar2;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<float[4]> SStack_58;
  
  if (7 < type - QUERY_SAMPLER_PARAM_INTEGER) {
    return;
  }
  switch(type) {
  case QUERY_SAMPLER_PARAM_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameteriv
              (gl,sampler,pname,(GLint *)(SStack_58.m_preguard + 1));
    pcVar2 = "glGetSamplerParameteriv";
    break;
  case QUERY_SAMPLER_PARAM_FLOAT:
    StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float> *)&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameterfv(gl,sampler,pname,SStack_58.m_preguard + 1);
    bVar1 = checkError(result,gl,"glGetSamplerParameteriv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                      ((StateQueryMemoryWriteGuard<float> *)&SStack_58,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT;
    (state->m_v).vInt = (GLint)SStack_58.m_preguard[1];
    return;
  case QUERY_SAMPLER_PARAM_PURE_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameterIiv
              (gl,sampler,pname,(GLint *)(SStack_58.m_preguard + 1));
    pcVar2 = "glGetSamplerParameterIiv";
    break;
  case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER:
    StateQueryMemoryWriteGuard<unsigned_int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<unsigned_int> *)&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameterIuiv
              (gl,sampler,pname,(GLuint *)(SStack_58.m_preguard + 1));
    bVar1 = checkError(result,gl,"glGetSamplerParameterIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int> *)&SStack_58,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER;
    goto LAB_00454768;
  case QUERY_SAMPLER_PARAM_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[4]> *)&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameteriv(gl,sampler,pname,(GLint *)SStack_58.m_value);
    pcVar2 = "glGetSamplerParameteriv";
    goto LAB_00454887;
  case QUERY_SAMPLER_PARAM_FLOAT_VEC4:
    StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard(&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameterfv(gl,sampler,pname,SStack_58.m_value);
    bVar1 = checkError(result,gl,"glGetSamplerParameteriv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float[4]>::verifyValidity(&SStack_58,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT_VEC4;
    goto LAB_004548ab;
  case QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[4]> *)&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameterIiv(gl,sampler,pname,(GLint *)SStack_58.m_value);
    pcVar2 = "glGetSamplerParameterIiv";
LAB_00454887:
    bVar1 = checkError(result,gl,pcVar2);
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int[4]> *)&SStack_58,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_INTEGER_VEC4;
LAB_004548ab:
    (state->m_v).vInt64 = SStack_58.m_value._0_8_;
    (state->m_v).vInt64Vec4[1] = SStack_58.m_value._8_8_;
    return;
  case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<unsigned_int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)&SStack_58);
    glu::CallLogWrapper::glGetSamplerParameterIuiv(gl,sampler,pname,(GLuint *)SStack_58.m_value);
    bVar1 = checkError(result,gl,"glGetSamplerParameterIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)&SStack_58,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER_VEC4;
    goto LAB_004548ab;
  }
  bVar1 = checkError(result,gl,pcVar2);
  if (!bVar1) {
    return;
  }
  bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&SStack_58,result);
  if (!bVar1) {
    return;
  }
  state->m_type = DATATYPE_INTEGER;
LAB_00454768:
  (state->m_v).vInt = (GLint)SStack_58.m_preguard[1];
  return;
}

Assistant:

void querySamplerState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint sampler, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_SAMPLER_PARAM_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetSamplerParameteriv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetSamplerParameterfv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetSamplerParameterIiv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLuint> value;
			gl.glGetSamplerParameterIuiv(sampler, pname, &value);

			if (!checkError(result, gl, "glGetSamplerParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetSamplerParameteriv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_FLOAT_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat[4]> value;
			gl.glGetSamplerParameterfv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetSamplerParameterIiv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLuint[4]> value;
			gl.glGetSamplerParameterIuiv(sampler, pname, value);

			if (!checkError(result, gl, "glGetSamplerParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}